

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O1

bool __thiscall server::ctfservmode::addflag(ctfservmode *this,int i,vec *o,int team,int invistime)

{
  flag *pfVar1;
  flag *pfVar2;
  
  if ((uint)i < 0x14) {
    while ((this->flags).ulen <= i) {
      vector<server::ctfservmode::flag>::add(&this->flags);
    }
    pfVar1 = (this->flags).buf;
    pfVar1[(uint)i].id = i;
    pfVar1[(uint)i].version = 0;
    pfVar1[(uint)i].spawnindex = -1;
    *(undefined8 *)&pfVar1[(uint)i].spawnloc.field_0 = 0;
    pfVar1[(uint)i].spawnloc.field_0.field_0.z = 0.0;
    *(undefined8 *)&pfVar1[(uint)i].droploc.field_0 = 0;
    pfVar1[(uint)i].droploc.field_0.field_0.z = 0.0;
    pfVar2 = pfVar1 + (uint)i;
    pfVar2->owner = -1;
    pfVar2->dropcount = 0;
    *(undefined8 *)(&pfVar2->owner + 2) = 0xffffffff;
    pfVar2 = pfVar1 + (uint)i;
    pfVar2->team = 0;
    pfVar2->droptime = 0;
    *(undefined8 *)(&pfVar2->team + 2) = 0;
    pfVar1[(uint)i].team = team;
    pfVar1[(uint)i].spawnloc.field_0.field_0.z = (o->field_0).field_0.z;
    *(undefined8 *)&pfVar1[(uint)i].spawnloc.field_0 = *(undefined8 *)&o->field_0;
    pfVar1[(uint)i].invistime = invistime;
  }
  return (uint)i < 0x14;
}

Assistant:

bool addflag(int i, const vec &o, int team, int vistime = -1000)
#endif
    {
        if(i<0 || i>=MAXFLAGS) return false;
        while(flags.length()<=i) flags.add();
        flag &f = flags[i];
        f.id = i;
        f.reset();
        f.team = team;
        f.spawnloc = o;
#ifdef SERVMODE
        f.invistime = invistime;
#else
        f.vistime = vistime;
#endif
        return true;
    }